

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O0

double sync_get_val(sync_track *t,double row)

{
  int iVar1;
  double dVar2;
  int irow;
  int idx;
  double row_local;
  sync_track *t_local;
  
  if (t->num_keys == 0) {
    t_local = (sync_track *)0x0;
  }
  else {
    dVar2 = floor(row);
    iVar1 = key_idx_floor(t,(int)dVar2);
    if (iVar1 < 0) {
      t_local = (sync_track *)(double)t->keys->value;
    }
    else if (t->num_keys + -2 < iVar1) {
      t_local = (sync_track *)(double)t->keys[t->num_keys + -1].value;
    }
    else {
      switch(t->keys[iVar1].type) {
      case KEY_STEP:
        t_local = (sync_track *)(double)t->keys[iVar1].value;
        break;
      case KEY_LINEAR:
        t_local = (sync_track *)key_linear(t->keys + iVar1,row);
        break;
      case KEY_SMOOTH:
        t_local = (sync_track *)key_smooth(t->keys + iVar1,row);
        break;
      case KEY_RAMP:
        t_local = (sync_track *)key_ramp(t->keys + iVar1,row);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/rocket/lib/track.c"
                      ,0x39,"double sync_get_val(const struct sync_track *, double)");
      }
    }
  }
  return (double)t_local;
}

Assistant:

double sync_get_val(const struct sync_track *t, double row)
{
	int idx, irow;

	/* If we have no keys at all, return a constant 0 */
	if (!t->num_keys)
		return 0.0f;

	irow = (int)floor(row);
	idx = key_idx_floor(t, irow);

	/* at the edges, return the first/last value */
	if (idx < 0)
		return t->keys[0].value;
	if (idx > (int)t->num_keys - 2)
		return t->keys[t->num_keys - 1].value;

	/* interpolate according to key-type */
	switch (t->keys[idx].type) {
	case KEY_STEP:
		return t->keys[idx].value;
	case KEY_LINEAR:
		return key_linear(t->keys + idx, row);
	case KEY_SMOOTH:
		return key_smooth(t->keys + idx, row);
	case KEY_RAMP:
		return key_ramp(t->keys + idx, row);
	default:
		assert(0);
		return 0.0f;
	}
}